

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskFileIndex.cpp
# Opt level: O0

string * __thiscall OnDiskFileIndex::get_file_name_abi_cxx11_(OnDiskFileIndex *this,FileId fid)

{
  int __fd;
  RawFile *this_00;
  void *__n;
  uint in_EDX;
  allocator<char> *in_RSI;
  string *in_RDI;
  __off_t in_R8;
  uint64_t filename_length;
  uint64_t filename_end;
  uint64_t filename_start;
  uint64_t ptrs [2];
  string *filename;
  string *psVar1;
  char __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined1 local_42 [10];
  long local_38;
  undefined8 local_30;
  size_t local_28;
  long local_20;
  uint local_14;
  
  psVar1 = in_RDI;
  local_14 = in_EDX;
  this_00 = std::optional<RawFile>::operator->((optional<RawFile> *)0x1cc4bb);
  __c = (char)((ulong)psVar1 >> 0x38);
  RawFile::pread(this_00,(int)&local_28,(void *)0x10,(ulong)local_14 << 3,in_R8);
  local_30 = local_28;
  local_38 = local_20 + -1;
  __n = (void *)(local_38 - local_28);
  local_42[1] = 0;
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_42;
  local_42._2_8_ = __n;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(size_type)__n,__c,in_RSI);
  std::allocator<char>::~allocator((allocator<char> *)local_42);
  __fd = std::__cxx11::string::data();
  RawFile::pread((RawFile *)(in_RSI + 0x88),__fd,(void *)local_42._2_8_,local_30,in_R8);
  return in_RDI;
}

Assistant:

std::string OnDiskFileIndex::get_file_name(FileId fid) const {
    uint64_t ptrs[2];
    cache_file->pread(&ptrs, sizeof(ptrs), fid * sizeof(uint64_t));

    uint64_t filename_start = ptrs[0];
    uint64_t filename_end = ptrs[1] - 1;
    uint64_t filename_length = filename_end - filename_start;

    std::string filename(filename_length, '\x00');
    files_file.pread(filename.data(), filename_length, filename_start);
    return filename;
}